

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int send_flow(SESSION_INSTANCE *session)

{
  int iVar1;
  FLOW_HANDLE flow_00;
  AMQP_VALUE performative;
  AMQP_VALUE flow_performative_value;
  FLOW_HANDLE flow;
  int result;
  SESSION_INSTANCE *session_local;
  
  if (session == (SESSION_INSTANCE *)0x0) {
    flow._4_4_ = 0x114;
  }
  else {
    flow_00 = flow_create(session->incoming_window,session->next_outgoing_id,
                          session->outgoing_window);
    if (flow_00 == (FLOW_HANDLE)0x0) {
      flow._4_4_ = 0x11c;
    }
    else {
      iVar1 = flow_set_next_incoming_id(flow_00,session->next_incoming_id);
      if (iVar1 == 0) {
        performative = amqpvalue_create_flow(flow_00);
        if (performative == (AMQP_VALUE)0x0) {
          flow._4_4_ = 0x129;
        }
        else {
          iVar1 = connection_encode_frame
                            (session->endpoint,performative,(PAYLOAD *)0x0,0,(ON_SEND_COMPLETE)0x0,
                             (void *)0x0);
          if (iVar1 == 0) {
            flow._4_4_ = 0;
          }
          else {
            flow._4_4_ = 0x12f;
          }
          amqpvalue_destroy(performative);
        }
      }
      else {
        flow._4_4_ = 0x122;
      }
      flow_destroy(flow_00);
    }
  }
  return flow._4_4_;
}

Assistant:

static int send_flow(LINK_INSTANCE* link)
{
    int result;
    FLOW_HANDLE flow = flow_create(0, 0, 0);

    if (flow == NULL)
    {
        LogError("NULL flow performative");
        result = MU_FAILURE;
    }
    else
    {
        if (flow_set_link_credit(flow, link->current_link_credit) != 0)
        {
            LogError("Cannot set link credit on flow performative");
            result = MU_FAILURE;
        }
        else if (flow_set_handle(flow, link->handle) != 0)
        {
            LogError("Cannot set handle on flow performative");
            result = MU_FAILURE;
        }
        else if (flow_set_delivery_count(flow, link->delivery_count) != 0)
        {
            LogError("Cannot set delivery count on flow performative");
            result = MU_FAILURE;
        }
        else
        {
            if (session_send_flow(link->link_endpoint, flow) != 0)
            {
                LogError("Sending flow frame failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        flow_destroy(flow);
    }

    return result;
}